

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O2

void kat::
     WriteAndReadRows<std::map<kat::period_event,kat::fin_data,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>>
               (map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                *data_lt,
               _func_void_map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>_ptr_fin_data_ptr
               **GetRow)

{
  iterator __position;
  char *pcVar1;
  fin_data row;
  fin_data local_1038;
  
  while ((data_lt->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __position._M_node = (data_lt->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    fputs((char *)&__position._M_node[1]._M_left,_stdout);
    local_1038.fin = (FILE *)__position._M_node[1]._M_parent;
    std::
    _Rb_tree<kat::period_event,std::pair<kat::period_event_const,kat::fin_data>,std::_Select1st<std::pair<kat::period_event_const,kat::fin_data>>,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>
    ::erase_abi_cxx11_((_Rb_tree<kat::period_event,std::pair<kat::period_event_const,kat::fin_data>,std::_Select1st<std::pair<kat::period_event_const,kat::fin_data>>,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>
                        *)data_lt,__position);
    pcVar1 = fgets(local_1038.data,0x1000,(FILE *)local_1038.fin);
    if (pcVar1 != (char *)0x0) {
      (**GetRow)(data_lt,&local_1038);
    }
  }
  return;
}

Assistant:

inline void WriteAndReadRows(rowMapT &data_lt,
				     void (*&GetRow)(rowMapT&, const fin_data&)) {
		while (data_lt.size() != 0) {
			auto iter = data_lt.begin();
			fprintf(stdout, "%s", iter->second.data);

			fin_data row;
			row.fin = iter->second.fin;
			data_lt.erase(iter);
			if (fgets(row.data, sizeof(row.data), row.fin) != nullptr)
			{
				GetRow(data_lt, row);
			}
		}
	}